

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  vfloat<4> vVar2;
  vfloat<4> vVar3;
  size_t sVar4;
  size_t sVar5;
  _func_int **pp_Var6;
  undefined4 uVar7;
  uint uVar8;
  ulong uVar9;
  ulong extraout_RDX;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  size_t in_R9;
  ulong uVar16;
  NodeRef *pNVar17;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar18;
  long lVar19;
  bool bVar20;
  float fVar21;
  float fVar28;
  float fVar29;
  vint4 bi;
  float fVar30;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar31 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar32;
  float fVar33;
  float fVar36;
  float fVar37;
  vint4 bi_1;
  float fVar38;
  undefined1 auVar34 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar35;
  float fVar39;
  float fVar43;
  float fVar44;
  vint4 ai;
  float fVar45;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar46;
  float fVar48;
  float fVar49;
  vint4 ai_1;
  undefined1 auVar47 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  vint4 ai_3;
  float fVar57;
  float fVar58;
  uint uVar63;
  uint uVar64;
  vint4 bi_2;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint uVar65;
  undefined1 auVar62 [16];
  float fVar66;
  float fVar69;
  float fVar70;
  vint4 bi_3;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar71;
  uint uVar72;
  uint uVar75;
  uint uVar76;
  vint4 ai_2;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  uint uVar77;
  float fVar78;
  float fVar80;
  float fVar81;
  undefined1 auVar79 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar89;
  float fVar90;
  undefined1 in_XMM11 [16];
  undefined1 auVar88 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 in_XMM12 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 in_XMM13 [16];
  float fVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  vint<4> octant;
  vint4 bi_8;
  undefined1 local_17d8 [16];
  RayHitK<4> *local_17c8;
  long local_17c0;
  undefined1 local_17b8 [16];
  RTCIntersectFunctionNArguments local_17a0;
  Geometry *local_1770;
  undefined8 local_1768;
  RTCIntersectArguments *local_1760;
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16f8;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      intersectCoherent(valid_i,This,ray,context);
      return;
    }
    auVar61._8_4_ = 0xffffffff;
    auVar61._0_8_ = 0xffffffffffffffff;
    auVar61._12_4_ = 0xffffffff;
    auVar47._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
    auVar47._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
    auVar47._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
    auVar47._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
    iVar13 = movmskps((int)This,auVar47);
    uVar14 = CONCAT44((int)((ulong)This >> 0x20),iVar13);
    if (iVar13 != 0) {
      fVar83 = *(float *)ray;
      fVar84 = *(float *)(ray + 4);
      fVar85 = *(float *)(ray + 8);
      fVar86 = *(float *)(ray + 0xc);
      auVar60 = *(undefined1 (*) [16])(ray + 0x40);
      fVar51 = (float)DAT_01ff1d40;
      fVar53 = DAT_01ff1d40._4_4_;
      fVar55 = DAT_01ff1d40._8_4_;
      fVar57 = DAT_01ff1d40._12_4_;
      auVar79._4_4_ = -(uint)(ABS(auVar60._4_4_) < fVar53);
      auVar79._0_4_ = -(uint)(ABS(auVar60._0_4_) < fVar51);
      auVar79._8_4_ = -(uint)(ABS(auVar60._8_4_) < fVar55);
      auVar79._12_4_ = -(uint)(ABS(auVar60._12_4_) < fVar57);
      auVar67 = blendvps(auVar60,_DAT_01ff1d40,auVar79);
      auVar79 = *(undefined1 (*) [16])(ray + 0x50);
      auVar73._4_4_ = -(uint)(ABS(auVar79._4_4_) < fVar53);
      auVar73._0_4_ = -(uint)(ABS(auVar79._0_4_) < fVar51);
      auVar73._8_4_ = -(uint)(ABS(auVar79._8_4_) < fVar55);
      auVar73._12_4_ = -(uint)(ABS(auVar79._12_4_) < fVar57);
      auVar73 = blendvps(auVar79,_DAT_01ff1d40,auVar73);
      auVar79 = *(undefined1 (*) [16])(ray + 0x60);
      auVar88._4_4_ = -(uint)(ABS(auVar79._4_4_) < fVar53);
      auVar88._0_4_ = -(uint)(ABS(auVar79._0_4_) < fVar51);
      auVar88._8_4_ = -(uint)(ABS(auVar79._8_4_) < fVar55);
      auVar88._12_4_ = -(uint)(ABS(auVar79._12_4_) < fVar57);
      auVar79 = blendvps(auVar79,_DAT_01ff1d40,auVar88);
      auVar88 = rcpps(in_XMM11,auVar67);
      fVar87 = auVar88._0_4_;
      fVar89 = auVar88._4_4_;
      fVar90 = auVar88._8_4_;
      fVar91 = auVar88._12_4_;
      auVar88 = rcpps(in_XMM12,auVar73);
      fVar92 = auVar88._0_4_;
      fVar93 = auVar88._4_4_;
      fVar94 = auVar88._8_4_;
      fVar95 = auVar88._12_4_;
      auVar88 = rcpps(in_XMM13,auVar79);
      fVar96 = auVar88._0_4_;
      fVar97 = auVar88._4_4_;
      fVar98 = auVar88._8_4_;
      fVar99 = auVar88._12_4_;
      auVar59._0_8_ =
           CONCAT44(-(uint)(auVar60._4_4_ < 0.0),-(uint)(auVar60._0_4_ < 0.0)) & 0x100000001;
      auVar59._8_4_ = -(uint)(auVar60._8_4_ < 0.0) & 1;
      auVar59._12_4_ = -(uint)(auVar60._12_4_ < 0.0) & 1;
      auVar74._0_8_ =
           CONCAT44(-(uint)(*(float *)(ray + 0x54) < 0.0),-(uint)(*(float *)(ray + 0x50) < 0.0)) &
           0x200000002;
      auVar74._8_4_ = -(uint)(*(float *)(ray + 0x58) < 0.0) & 2;
      auVar74._12_4_ = -(uint)(*(float *)(ray + 0x5c) < 0.0) & 2;
      fVar78 = *(float *)(ray + 0x10);
      fVar80 = *(float *)(ray + 0x14);
      fVar81 = *(float *)(ray + 0x18);
      fVar82 = *(float *)(ray + 0x1c);
      fVar51 = *(float *)(ray + 0x20);
      fVar53 = *(float *)(ray + 0x24);
      fVar55 = *(float *)(ray + 0x28);
      fVar57 = *(float *)(ray + 0x2c);
      auVar60._0_8_ =
           CONCAT44(-(uint)(*(float *)(ray + 100) < 0.0),-(uint)(*(float *)(ray + 0x60) < 0.0)) &
           0x400000004;
      auVar60._8_4_ = -(uint)(*(float *)(ray + 0x68) < 0.0) & 4;
      auVar60._12_4_ = -(uint)(*(float *)(ray + 0x6c) < 0.0) & 4;
      local_17d8 = auVar47 ^ auVar61 | auVar60 | auVar74 | auVar59;
      do {
        lVar19 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
          }
        }
        iVar13 = *(int *)(local_17d8 + lVar19 * 4);
        auVar68._0_4_ = -(uint)(iVar13 == local_17d8._0_4_);
        auVar68._4_4_ = -(uint)(iVar13 == local_17d8._4_4_);
        auVar68._8_4_ = -(uint)(iVar13 == local_17d8._8_4_);
        auVar68._12_4_ = -(uint)(iVar13 == local_17d8._12_4_);
        uVar7 = movmskps((int)lVar19,auVar68);
        uVar9 = ~CONCAT44((int)((ulong)lVar19 >> 0x20),uVar7);
        uVar14 = uVar14 & uVar9;
      } while (uVar14 != 0);
      auVar31._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
      auVar31._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
      auVar31._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
      auVar31._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
      fVar87 = fVar87 + (1.0 - auVar67._0_4_ * fVar87) * fVar87;
      fVar89 = fVar89 + (1.0 - auVar67._4_4_ * fVar89) * fVar89;
      fVar90 = fVar90 + (1.0 - auVar67._8_4_ * fVar90) * fVar90;
      fVar91 = fVar91 + (1.0 - auVar67._12_4_ * fVar91) * fVar91;
      fVar92 = fVar92 + (1.0 - auVar73._0_4_ * fVar92) * fVar92;
      fVar93 = fVar93 + (1.0 - auVar73._4_4_ * fVar93) * fVar93;
      fVar94 = fVar94 + (1.0 - auVar73._8_4_ * fVar94) * fVar94;
      fVar95 = fVar95 + (1.0 - auVar73._12_4_ * fVar95) * fVar95;
      fVar96 = fVar96 + (1.0 - auVar79._0_4_ * fVar96) * fVar96;
      fVar97 = fVar97 + (1.0 - auVar79._4_4_ * fVar97) * fVar97;
      fVar98 = fVar98 + (1.0 - auVar79._8_4_ * fVar98) * fVar98;
      fVar99 = fVar99 + (1.0 - auVar79._12_4_ * fVar99) * fVar99;
      auVar47 = maxps(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0));
      auVar61 = maxps(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0));
      iVar13 = (int)DAT_01feb9f0;
      iVar100 = DAT_01feb9f0._4_4_;
      iVar101 = DAT_01feb9f0._8_4_;
      iVar102 = DAT_01feb9f0._12_4_;
      local_16f8.v = (__m128)blendvps(_DAT_01feb9f0,auVar47,auVar31);
      bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     blendvps(_DAT_01feba00,auVar61,auVar31);
      pNVar17 = stack_node + 2;
      paVar18 = &stack_near[2].field_0;
      local_17d8 = auVar31 | local_17d8;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01feb9f0;
      sVar5 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      stack_node[1].ptr = sVar5;
      stack_near[1].field_0 = local_16f8;
      do {
        paVar18 = paVar18 + -1;
        pNVar1 = pNVar17 + -1;
        pNVar17 = pNVar17 + -1;
        sVar5 = CONCAT71((int7)(sVar5 >> 8),1);
        if (pNVar1->ptr != 0xfffffffffffffff8) {
          aVar35.v = *(__m128 *)paVar18->v;
          auVar67._4_4_ = -(uint)(aVar35.v[1] < (float)bi_8.field_0.i[1]);
          auVar67._0_4_ = -(uint)(aVar35.v[0] < (float)bi_8.field_0.i[0]);
          auVar67._8_4_ = -(uint)(aVar35.v[2] < (float)bi_8.field_0.i[2]);
          auVar67._12_4_ = -(uint)(aVar35.v[3] < (float)bi_8.field_0.i[3]);
          uVar8 = movmskps((int)uVar9,auVar67);
          uVar9 = (ulong)uVar8;
          sVar10 = pNVar1->ptr;
          if (uVar8 != 0) {
            do {
              if ((sVar10 & 8) != 0) {
                if (sVar10 == 0xfffffffffffffff8) goto LAB_00256a39;
                local_17b8._4_4_ = -(uint)(aVar35.v[1] < (float)bi_8.field_0.i[1]);
                local_17b8._0_4_ = -(uint)(aVar35.v[0] < (float)bi_8.field_0.i[0]);
                local_17b8._8_4_ = -(uint)(aVar35.v[2] < (float)bi_8.field_0.i[2]);
                local_17b8._12_4_ = -(uint)(aVar35.v[3] < (float)bi_8.field_0.i[3]);
                iVar15 = movmskps((int)sVar5,local_17b8);
                if (iVar15 != 0) {
                  local_17c0 = (ulong)((uint)sVar10 & 0xf) - 8;
                  if (local_17c0 != 0) {
                    lVar19 = 0;
                    local_17c8 = ray;
                    local_1708 = fVar83;
                    fStack_1704 = fVar84;
                    fStack_1700 = fVar85;
                    fStack_16fc = fVar86;
                    local_1718 = fVar87;
                    fStack_1714 = fVar89;
                    fStack_1710 = fVar90;
                    fStack_170c = fVar91;
                    local_1728 = fVar92;
                    fStack_1724 = fVar93;
                    fStack_1720 = fVar94;
                    fStack_171c = fVar95;
                    local_1738 = fVar96;
                    fStack_1734 = fVar97;
                    fStack_1730 = fVar98;
                    fStack_172c = fVar99;
                    local_1748 = fVar78;
                    fStack_1744 = fVar80;
                    fStack_1740 = fVar81;
                    fStack_173c = fVar82;
                    local_1758 = fVar51;
                    fStack_1754 = fVar53;
                    fStack_1750 = fVar55;
                    fStack_174c = fVar57;
                    do {
                      local_17a0.geomID = *(uint *)((sVar10 & 0xfffffffffffffff0) + lVar19 * 8);
                      local_1770 = (context->scene->geometries).items[local_17a0.geomID].ptr;
                      uVar8 = local_1770->mask;
                      auVar27._0_4_ = -(uint)((uVar8 & *(uint *)(ray + 0x90)) == 0);
                      auVar27._4_4_ = -(uint)((uVar8 & *(uint *)(ray + 0x94)) == 0);
                      auVar27._8_4_ = -(uint)((uVar8 & *(uint *)(ray + 0x98)) == 0);
                      auVar27._12_4_ = -(uint)((uVar8 & *(uint *)(ray + 0x9c)) == 0);
                      mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                     (~auVar27 & local_17b8);
                      uVar8 = movmskps((int)uVar9,(undefined1  [16])mask.field_0);
                      uVar9 = (ulong)uVar8;
                      if (uVar8 != 0) {
                        local_17a0.primID =
                             *(uint *)((sVar10 & 0xfffffffffffffff0) + 4 + lVar19 * 8);
                        local_17a0.valid = (int *)&mask;
                        local_17a0.geometryUserPtr = local_1770->userPtr;
                        local_17a0.context = context->user;
                        local_17a0.N = 4;
                        local_1768 = 0;
                        local_1760 = context->args;
                        pp_Var6 = (_func_int **)local_1760->intersect;
                        if (pp_Var6 == (_func_int **)0x0) {
                          pp_Var6 = local_1770[1].super_RefCount._vptr_RefCount;
                        }
                        local_17a0.rayhit = (RTCRayHitN *)ray;
                        (*(code *)pp_Var6)(&local_17a0);
                        iVar13 = 0x7f800000;
                        iVar100 = 0x7f800000;
                        iVar101 = 0x7f800000;
                        iVar102 = 0x7f800000;
                        uVar9 = extraout_RDX;
                        ray = local_17c8;
                        fVar83 = local_1708;
                        fVar84 = fStack_1704;
                        fVar85 = fStack_1700;
                        fVar86 = fStack_16fc;
                        fVar51 = local_1758;
                        fVar53 = fStack_1754;
                        fVar55 = fStack_1750;
                        fVar57 = fStack_174c;
                        fVar78 = local_1748;
                        fVar80 = fStack_1744;
                        fVar81 = fStack_1740;
                        fVar82 = fStack_173c;
                        fVar87 = local_1718;
                        fVar89 = fStack_1714;
                        fVar90 = fStack_1710;
                        fVar91 = fStack_170c;
                        fVar92 = local_1728;
                        fVar93 = fStack_1724;
                        fVar94 = fStack_1720;
                        fVar95 = fStack_171c;
                        fVar96 = local_1738;
                        fVar97 = fStack_1734;
                        fVar98 = fStack_1730;
                        fVar99 = fStack_172c;
                      }
                      lVar19 = lVar19 + 1;
                    } while (local_17c0 != lVar19);
                  }
                  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                 blendvps((undefined1  [16])bi_8.field_0,
                                          *(undefined1 (*) [16])(ray + 0x80),local_17b8);
                }
                break;
              }
              uVar16 = 0;
              aVar32.i[1] = iVar100;
              aVar32.i[0] = iVar13;
              aVar32.i[2] = iVar101;
              aVar32.i[3] = iVar102;
              sVar11 = 8;
              uVar14 = 0;
              do {
                sVar4 = *(size_t *)((sVar10 & 0xfffffffffffffff0) + uVar14 * 8);
                sVar12 = sVar11;
                aVar35 = aVar32;
                if (sVar4 != 8) {
                  fVar71 = *(float *)(sVar10 + 0x20 + uVar14 * 4);
                  fVar30 = *(float *)(sVar10 + 0x30 + uVar14 * 4);
                  fVar21 = *(float *)(sVar10 + 0x40 + uVar14 * 4);
                  fVar38 = *(float *)(sVar10 + 0x50 + uVar14 * 4);
                  fVar39 = (fVar71 - fVar83) * fVar87;
                  fVar43 = (fVar71 - fVar84) * fVar89;
                  fVar44 = (fVar71 - fVar85) * fVar90;
                  fVar45 = (fVar71 - fVar86) * fVar91;
                  fVar46 = (fVar21 - fVar78) * fVar92;
                  fVar48 = (fVar21 - fVar80) * fVar93;
                  fVar49 = (fVar21 - fVar81) * fVar94;
                  fVar50 = (fVar21 - fVar82) * fVar95;
                  fVar71 = *(float *)(sVar10 + 0x60 + uVar14 * 4);
                  fVar52 = (fVar71 - fVar51) * fVar96;
                  fVar54 = (fVar71 - fVar53) * fVar97;
                  fVar56 = (fVar71 - fVar55) * fVar98;
                  fVar58 = (fVar71 - fVar57) * fVar99;
                  fVar21 = (fVar30 - fVar83) * fVar87;
                  fVar28 = (fVar30 - fVar84) * fVar89;
                  fVar29 = (fVar30 - fVar85) * fVar90;
                  fVar30 = (fVar30 - fVar86) * fVar91;
                  fVar33 = (fVar38 - fVar78) * fVar92;
                  fVar36 = (fVar38 - fVar80) * fVar93;
                  fVar37 = (fVar38 - fVar81) * fVar94;
                  fVar38 = (fVar38 - fVar82) * fVar95;
                  fVar71 = *(float *)(sVar10 + 0x70 + uVar14 * 4);
                  fVar66 = (fVar71 - fVar51) * fVar96;
                  fVar69 = (fVar71 - fVar53) * fVar97;
                  fVar70 = (fVar71 - fVar55) * fVar98;
                  fVar71 = (fVar71 - fVar57) * fVar99;
                  uVar8 = (uint)((int)fVar21 < (int)fVar39) * (int)fVar21 |
                          (uint)((int)fVar21 >= (int)fVar39) * (int)fVar39;
                  uVar63 = (uint)((int)fVar28 < (int)fVar43) * (int)fVar28 |
                           (uint)((int)fVar28 >= (int)fVar43) * (int)fVar43;
                  uVar64 = (uint)((int)fVar29 < (int)fVar44) * (int)fVar29 |
                           (uint)((int)fVar29 >= (int)fVar44) * (int)fVar44;
                  uVar65 = (uint)((int)fVar30 < (int)fVar45) * (int)fVar30 |
                           (uint)((int)fVar30 >= (int)fVar45) * (int)fVar45;
                  uVar72 = (uint)((int)fVar33 < (int)fVar46) * (int)fVar33 |
                           (uint)((int)fVar33 >= (int)fVar46) * (int)fVar46;
                  uVar75 = (uint)((int)fVar36 < (int)fVar48) * (int)fVar36 |
                           (uint)((int)fVar36 >= (int)fVar48) * (int)fVar48;
                  uVar76 = (uint)((int)fVar37 < (int)fVar49) * (int)fVar37 |
                           (uint)((int)fVar37 >= (int)fVar49) * (int)fVar49;
                  uVar77 = (uint)((int)fVar38 < (int)fVar50) * (int)fVar38 |
                           (uint)((int)fVar38 >= (int)fVar50) * (int)fVar50;
                  uVar72 = ((int)uVar72 < (int)uVar8) * uVar8 | ((int)uVar72 >= (int)uVar8) * uVar72
                  ;
                  uVar75 = ((int)uVar75 < (int)uVar63) * uVar63 |
                           ((int)uVar75 >= (int)uVar63) * uVar75;
                  uVar76 = ((int)uVar76 < (int)uVar64) * uVar64 |
                           ((int)uVar76 >= (int)uVar64) * uVar76;
                  uVar77 = ((int)uVar77 < (int)uVar65) * uVar65 |
                           ((int)uVar77 >= (int)uVar65) * uVar77;
                  uVar8 = (uint)((int)fVar66 < (int)fVar52) * (int)fVar66 |
                          (uint)((int)fVar66 >= (int)fVar52) * (int)fVar52;
                  uVar63 = (uint)((int)fVar69 < (int)fVar54) * (int)fVar69 |
                           (uint)((int)fVar69 >= (int)fVar54) * (int)fVar54;
                  uVar64 = (uint)((int)fVar70 < (int)fVar56) * (int)fVar70 |
                           (uint)((int)fVar70 >= (int)fVar56) * (int)fVar56;
                  uVar65 = (uint)((int)fVar71 < (int)fVar58) * (int)fVar71 |
                           (uint)((int)fVar71 >= (int)fVar58) * (int)fVar58;
                  auVar62._0_4_ =
                       ((int)uVar8 < (int)uVar72) * uVar72 | ((int)uVar8 >= (int)uVar72) * uVar8;
                  auVar62._4_4_ =
                       ((int)uVar63 < (int)uVar75) * uVar75 | ((int)uVar63 >= (int)uVar75) * uVar63;
                  auVar62._8_4_ =
                       ((int)uVar64 < (int)uVar76) * uVar76 | ((int)uVar64 >= (int)uVar76) * uVar64;
                  auVar62._12_4_ =
                       ((int)uVar65 < (int)uVar77) * uVar77 | ((int)uVar65 >= (int)uVar77) * uVar65;
                  uVar8 = (uint)((int)fVar21 < (int)fVar39) * (int)fVar39 |
                          (uint)((int)fVar21 >= (int)fVar39) * (int)fVar21;
                  uVar63 = (uint)((int)fVar28 < (int)fVar43) * (int)fVar43 |
                           (uint)((int)fVar28 >= (int)fVar43) * (int)fVar28;
                  uVar64 = (uint)((int)fVar29 < (int)fVar44) * (int)fVar44 |
                           (uint)((int)fVar29 >= (int)fVar44) * (int)fVar29;
                  uVar65 = (uint)((int)fVar30 < (int)fVar45) * (int)fVar45 |
                           (uint)((int)fVar30 >= (int)fVar45) * (int)fVar30;
                  uVar72 = (uint)((int)fVar33 < (int)fVar46) * (int)fVar46 |
                           (uint)((int)fVar33 >= (int)fVar46) * (int)fVar33;
                  uVar75 = (uint)((int)fVar36 < (int)fVar48) * (int)fVar48 |
                           (uint)((int)fVar36 >= (int)fVar48) * (int)fVar36;
                  uVar76 = (uint)((int)fVar37 < (int)fVar49) * (int)fVar49 |
                           (uint)((int)fVar37 >= (int)fVar49) * (int)fVar37;
                  uVar77 = (uint)((int)fVar38 < (int)fVar50) * (int)fVar50 |
                           (uint)((int)fVar38 >= (int)fVar50) * (int)fVar38;
                  uVar8 = ((int)uVar8 < (int)uVar72) * uVar8 | ((int)uVar8 >= (int)uVar72) * uVar72;
                  uVar63 = ((int)uVar63 < (int)uVar75) * uVar63 |
                           ((int)uVar63 >= (int)uVar75) * uVar75;
                  uVar64 = ((int)uVar64 < (int)uVar76) * uVar64 |
                           ((int)uVar64 >= (int)uVar76) * uVar76;
                  uVar65 = ((int)uVar65 < (int)uVar77) * uVar65 |
                           ((int)uVar65 >= (int)uVar77) * uVar77;
                  uVar72 = (uint)((int)fVar66 < (int)fVar52) * (int)fVar52 |
                           (uint)((int)fVar66 >= (int)fVar52) * (int)fVar66;
                  uVar75 = (uint)((int)fVar69 < (int)fVar54) * (int)fVar54 |
                           (uint)((int)fVar69 >= (int)fVar54) * (int)fVar69;
                  uVar76 = (uint)((int)fVar70 < (int)fVar56) * (int)fVar56 |
                           (uint)((int)fVar70 >= (int)fVar56) * (int)fVar70;
                  uVar77 = (uint)((int)fVar71 < (int)fVar58) * (int)fVar58 |
                           (uint)((int)fVar71 >= (int)fVar58) * (int)fVar71;
                  uVar72 = (uint)(bi_8.field_0.i[0] < (int)uVar72) * bi_8.field_0.i[0] |
                           (bi_8.field_0.i[0] >= (int)uVar72) * uVar72;
                  uVar75 = (uint)(bi_8.field_0.i[1] < (int)uVar75) * bi_8.field_0.i[1] |
                           (bi_8.field_0.i[1] >= (int)uVar75) * uVar75;
                  uVar76 = (uint)(bi_8.field_0.i[2] < (int)uVar76) * bi_8.field_0.i[2] |
                           (bi_8.field_0.i[2] >= (int)uVar76) * uVar76;
                  uVar77 = (uint)(bi_8.field_0.i[3] < (int)uVar77) * bi_8.field_0.i[3] |
                           (bi_8.field_0.i[3] >= (int)uVar77) * uVar77;
                  auVar22._4_4_ =
                       -(uint)((float)((uint)((int)auVar62._4_4_ < (int)local_16f8._4_4_) *
                                       local_16f8._4_4_ |
                                      ((int)auVar62._4_4_ >= (int)local_16f8._4_4_) * auVar62._4_4_)
                              <= (float)(((int)uVar63 < (int)uVar75) * uVar63 |
                                        ((int)uVar63 >= (int)uVar75) * uVar75));
                  auVar22._0_4_ =
                       -(uint)((float)((uint)((int)auVar62._0_4_ < (int)local_16f8._0_4_) *
                                       local_16f8._0_4_ |
                                      ((int)auVar62._0_4_ >= (int)local_16f8._0_4_) * auVar62._0_4_)
                              <= (float)(((int)uVar8 < (int)uVar72) * uVar8 |
                                        ((int)uVar8 >= (int)uVar72) * uVar72));
                  auVar22._8_4_ =
                       -(uint)((float)((uint)((int)auVar62._8_4_ < (int)local_16f8._8_4_) *
                                       local_16f8._8_4_ |
                                      ((int)auVar62._8_4_ >= (int)local_16f8._8_4_) * auVar62._8_4_)
                              <= (float)(((int)uVar64 < (int)uVar76) * uVar64 |
                                        ((int)uVar64 >= (int)uVar76) * uVar76));
                  auVar22._12_4_ =
                       -(uint)((float)((uint)((int)auVar62._12_4_ < (int)local_16f8._12_4_) *
                                       local_16f8._12_4_ |
                                      ((int)auVar62._12_4_ >= (int)local_16f8._12_4_) *
                                      auVar62._12_4_) <=
                              (float)(((int)uVar65 < (int)uVar77) * uVar65 |
                                     ((int)uVar65 >= (int)uVar77) * uVar77));
                  uVar8 = movmskps((int)in_R9,auVar22);
                  in_R9 = (ulong)uVar8;
                  if (uVar8 != 0) {
                    auVar34._4_4_ = iVar100;
                    auVar34._0_4_ = iVar13;
                    auVar34._8_4_ = iVar101;
                    auVar34._12_4_ = iVar102;
                    aVar35 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             blendvps(auVar34,auVar62,auVar22);
                    auVar23._4_4_ = -(uint)(aVar35.v[1] < aVar32.v[1]);
                    auVar23._0_4_ = -(uint)(aVar35.v[0] < aVar32.v[0]);
                    auVar23._8_4_ = -(uint)(aVar35.v[2] < aVar32.v[2]);
                    auVar23._12_4_ = -(uint)(aVar35.v[3] < aVar32.v[3]);
                    iVar15 = movmskps(uVar8,auVar23);
                    in_R9 = sVar4;
                    aVar24 = aVar35;
                    if ((iVar15 == 0) ||
                       (sVar12 = sVar4, in_R9 = sVar11, aVar24 = aVar32, aVar32 = aVar35,
                       sVar11 != 8)) {
                      aVar35 = aVar32;
                      uVar16 = uVar16 + 1;
                      pNVar17->ptr = in_R9;
                      pNVar17 = pNVar17 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18->v = aVar24;
                      paVar18 = paVar18 + 1;
                    }
                  }
                }
              } while ((sVar4 != 8) &&
                      (bVar20 = uVar14 < 3, sVar11 = sVar12, uVar14 = uVar14 + 1, aVar32 = aVar35,
                      bVar20));
              uVar9 = CONCAT71((int7)(sVar10 >> 8),sVar12 != 8);
              if (1 < uVar16 && sVar12 != 8) {
                vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18[-2].v;
                vVar3.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18[-1].v;
                auVar40._4_4_ = -(uint)(vVar2.field_0._4_4_ < vVar3.field_0._4_4_);
                auVar40._0_4_ = -(uint)(vVar2.field_0._0_4_ < vVar3.field_0._0_4_);
                auVar40._8_4_ = -(uint)(vVar2.field_0._8_4_ < vVar3.field_0._8_4_);
                auVar40._12_4_ = -(uint)(vVar2.field_0._12_4_ < vVar3.field_0._12_4_);
                uVar8 = movmskps((int)uVar9,auVar40);
                uVar9 = (ulong)uVar8;
                if (uVar8 != 0) {
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18[-2].v = vVar3.field_0;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18[-1].v = vVar2.field_0;
                  auVar47 = *(undefined1 (*) [16])(pNVar17 + -2);
                  auVar25._0_8_ = auVar47._8_8_;
                  auVar25._8_4_ = auVar47._0_4_;
                  auVar25._12_4_ = auVar47._4_4_;
                  *(undefined1 (*) [16])(pNVar17 + -2) = auVar25;
                }
                if (uVar16 != 2) {
                  fVar71 = paVar18[-3].v[0];
                  fVar30 = *(float *)((long)paVar18 + -0x2c);
                  fVar21 = *(float *)((long)paVar18 + -0x28);
                  fVar38 = *(float *)((long)paVar18 + -0x24);
                  auVar41._4_4_ = -(uint)(fVar30 < *(float *)((long)paVar18 + -0xc));
                  auVar41._0_4_ = -(uint)(fVar71 < paVar18[-1].v[0]);
                  auVar41._8_4_ = -(uint)(fVar21 < *(float *)((long)paVar18 + -8));
                  auVar41._12_4_ = -(uint)(fVar38 < *(float *)((long)paVar18 + -4));
                  uVar8 = movmskps(uVar8,auVar41);
                  uVar14 = (ulong)uVar8;
                  if (uVar8 != 0) {
                    paVar18[-3].v[0] = paVar18[-1].v[0];
                    *(float *)((long)paVar18 + -0x2c) = *(float *)((long)paVar18 + -0xc);
                    *(float *)((long)paVar18 + -0x28) = *(float *)((long)paVar18 + -8);
                    *(float *)((long)paVar18 + -0x24) = *(float *)((long)paVar18 + -4);
                    paVar18[-1].v[0] = fVar71;
                    *(float *)((long)paVar18 + -0xc) = fVar30;
                    *(float *)((long)paVar18 + -8) = fVar21;
                    *(float *)((long)paVar18 + -4) = fVar38;
                    sVar10 = pNVar17[-3].ptr;
                    uVar14 = pNVar17[-1].ptr;
                    pNVar17[-3].ptr = uVar14;
                    pNVar17[-1].ptr = sVar10;
                  }
                  vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18[-3].v;
                  vVar3.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18[-2].v;
                  auVar42._4_4_ = -(uint)(vVar2.field_0._4_4_ < vVar3.field_0._4_4_);
                  auVar42._0_4_ = -(uint)(vVar2.field_0._0_4_ < vVar3.field_0._0_4_);
                  auVar42._8_4_ = -(uint)(vVar2.field_0._8_4_ < vVar3.field_0._8_4_);
                  auVar42._12_4_ = -(uint)(vVar2.field_0._12_4_ < vVar3.field_0._12_4_);
                  uVar8 = movmskps((int)uVar14,auVar42);
                  uVar9 = (ulong)uVar8;
                  if (uVar8 != 0) {
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18[-3].v = vVar3.field_0;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18[-2].v = vVar2.field_0;
                    auVar47 = *(undefined1 (*) [16])(pNVar17 + -3);
                    auVar26._0_8_ = auVar47._8_8_;
                    auVar26._8_4_ = auVar47._0_4_;
                    auVar26._12_4_ = auVar47._4_4_;
                    *(undefined1 (*) [16])(pNVar17 + -3) = auVar26;
                  }
                }
              }
              sVar10 = sVar12;
            } while (sVar12 != 8);
          }
          sVar5 = 0;
        }
LAB_00256a39:
      } while ((char)sVar5 == '\0');
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }